

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_command.cpp
# Opt level: O2

void __thiscall duckdb::SleepCommand::ExecuteInternal(SleepCommand *this,ExecuteContext *context)

{
  idx_t iVar1;
  runtime_error *this_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  duration<double,_std::ratio<1L,_1000000000L>_> local_18;
  
  switch(this->unit) {
  case NANOSECOND:
    auVar2._0_8_ = (double)CONCAT44(0x43300000,(int)this->duration);
    auVar2._8_4_ = (int)(this->duration >> 0x20);
    auVar2._12_4_ = 0x45300000;
    local_18.__r = (auVar2._8_8_ - 1.9342813113834067e+25) + (auVar2._0_8_ - 4503599627370496.0);
    std::this_thread::sleep_for<double,std::ratio<1l,1000000000l>>(&local_18);
    return;
  case MICROSECOND:
    auVar4._0_8_ = (double)CONCAT44(0x43300000,(int)this->duration);
    auVar4._8_4_ = (int)(this->duration >> 0x20);
    auVar4._12_4_ = 0x45300000;
    local_18.__r = (auVar4._8_8_ - 1.9342813113834067e+25) + (auVar4._0_8_ - 4503599627370496.0);
    std::this_thread::sleep_for<double,std::ratio<1l,1000000l>>
              ((duration<double,_std::ratio<1L,_1000000L>_> *)&local_18);
    return;
  case MILLISECOND:
    iVar1 = this->duration;
    break;
  case SECOND:
    iVar1 = this->duration * 1000;
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Unrecognized sleep unit");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  auVar3._8_4_ = (int)(iVar1 >> 0x20);
  auVar3._0_8_ = iVar1;
  auVar3._12_4_ = 0x45300000;
  local_18.__r = (auVar3._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)iVar1) - 4503599627370496.0);
  std::this_thread::sleep_for<double,std::ratio<1l,1000l>>
            ((duration<double,_std::ratio<1L,_1000L>_> *)&local_18);
  return;
}

Assistant:

void SleepCommand::ExecuteInternal(ExecuteContext &context) const {
	switch (unit) {
	case SleepUnit::NANOSECOND:
		std::this_thread::sleep_for(std::chrono::duration<double, std::nano>(duration));
		break;
	case SleepUnit::MICROSECOND:
		std::this_thread::sleep_for(std::chrono::duration<double, std::micro>(duration));
		break;
	case SleepUnit::MILLISECOND:
		std::this_thread::sleep_for(std::chrono::duration<double, std::milli>(duration));
		break;
	case SleepUnit::SECOND:
		std::this_thread::sleep_for(std::chrono::duration<double, std::milli>(duration * 1000));
		break;
	default:
		throw std::runtime_error("Unrecognized sleep unit");
	}
}